

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcCondition::IfcCondition(IfcCondition *this)

{
  IfcCondition *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcGroup).field_0xf0,"IfcCondition");
  IfcGroup::IfcGroup(&this->super_IfcGroup,&PTR_construction_vtable_24__010fb720);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCondition,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCondition,_0UL> *)
             &(this->super_IfcGroup).super_IfcObject.field_0xe0,
             &PTR_construction_vtable_24__010fb7d0);
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0x10fb640;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0x10fb708;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0x88 = 0x10fb668;
  (this->super_IfcGroup).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0x10fb690;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0xd0 = 0x10fb6b8;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0xe0 = 0x10fb6e0;
  return;
}

Assistant:

IfcCondition() : Object("IfcCondition") {}